

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O3

void CMU462::Viewer::err_callback(int error,char *description)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[CMU462] ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GLFW Error: ",0xc);
  if (description == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x323770);
  }
  else {
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,description,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void Viewer::err_callback( int error, const char* description ) {
    out_err( "GLFW Error: " << description );
}